

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalTypeOptimization.cpp
# Opt level: O0

void __thiscall
wasm::(anonymous_namespace)::GlobalTypeOptimization::removeFieldsInInstructions(wasm::Module&)::
FieldRemover::visitStructSet(wasm::StructSet__(void *this,StructSet *curr)

{
  bool bVar1;
  Index IVar2;
  Module *pMVar3;
  Drop *pDVar4;
  Function *func;
  PassOptions *passOptions;
  Expression *pEVar5;
  RefAs *value;
  Expression *replacement;
  Expression *flipped;
  Builder builder;
  BasicType local_1c;
  Index newIndex;
  StructSet *curr_local;
  FieldRemover *this_local;
  
  local_1c = unreachable;
  _newIndex = curr;
  curr_local = (StructSet *)this;
  bVar1 = wasm::Type::operator==(&curr->ref->type,&local_1c);
  if (!bVar1) {
    builder.wasm = (Module *)wasm::Type::getHeapType(&_newIndex->ref->type);
    IVar2 = getNewIndex(wasm::HeapType_unsigned_int_(this,(HeapType)builder.wasm,_newIndex->index);
    if (IVar2 == 0xffffffff) {
      pMVar3 = Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>::getModule
                         ((Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_> *)
                          ((long)this + 0x58));
      Builder::Builder((Builder *)&flipped,pMVar3);
      pEVar5 = _newIndex->ref;
      pDVar4 = Builder::makeDrop((Builder *)&flipped,_newIndex->value);
      func = Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>::getFunction
                       ((Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_> *)
                        ((long)this + 0x58));
      pMVar3 = Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>::getModule
                         ((Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_> *)
                          ((long)this + 0x58));
      passOptions = Pass::getPassOptions((Pass *)this);
      pEVar5 = getResultOfFirst(pEVar5,(Expression *)pDVar4,func,pMVar3,passOptions);
      *(undefined1 *)((long)this + 0x138) = 1;
      value = Builder::makeRefAs((Builder *)&flipped,RefAsNonNull,pEVar5);
      pDVar4 = Builder::makeDrop((Builder *)&flipped,(Expression *)value);
      Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>::replaceCurrent
                ((Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_> *)((long)this + 0x58),
                 (Expression *)pDVar4);
    }
    else {
      _newIndex->index = IVar2;
    }
  }
  return;
}

Assistant:

void visitStructSet(StructSet* curr) {
        if (curr->ref->type == Type::unreachable) {
          return;
        }

        auto newIndex = getNewIndex(curr->ref->type.getHeapType(), curr->index);
        if (newIndex != RemovedField) {
          // Map to the new index.
          curr->index = newIndex;
        } else {
          // This field was removed, so just emit drops of our children, plus a
          // trap if the ref is null. Note that we must preserve the order of
          // operations here: the trap on a null ref happens after the value,
          // which might have side effects.
          Builder builder(*getModule());
          auto* flipped = getResultOfFirst(curr->ref,
                                           builder.makeDrop(curr->value),
                                           getFunction(),
                                           getModule(),
                                           getPassOptions());
          needEHFixups = true;
          Expression* replacement =
            builder.makeDrop(builder.makeRefAs(RefAsNonNull, flipped));
          // We only remove fields with no reads, so if this set is atomic,
          // there are no reads it can possibly synchronize with and we do not
          // need a fence.
          replaceCurrent(replacement);
        }
      }